

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dumper.cpp
# Opt level: O2

void __thiscall arangodb::velocypack::Dumper::appendUInt(Dumper *this,uint64_t v)

{
  uint uVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  uint uVar7;
  
  if (v < 10000000000000000000) {
    if (999999999999999999 < v) goto LAB_00108742;
    if (99999999999999999 < v) goto LAB_0010876c;
    if (9999999999999999 < v) goto LAB_0010879b;
    if (999999999999999 < v) goto LAB_001087bc;
    if (99999999999999 < v) goto LAB_001087e7;
    if (0x48c27394 < v >> 0xd) goto LAB_00108803;
    if (0xe8d4a50 < v >> 0xc) goto LAB_00108829;
    if (0x2e90edc < v >> 0xb) goto LAB_0010884f;
    if (0x9502f8 < v >> 10) goto LAB_00108875;
    if (999999999 < v) goto LAB_0010889b;
    if (99999999 < v) goto LAB_001088bd;
    if (9999999 < v) goto LAB_001088df;
    if (999999 < v) goto LAB_00108901;
    if (99999 < v) goto LAB_00108923;
    if (9999 < v) goto LAB_00108945;
    if (999 < v) goto LAB_00108967;
    if (99 < v) goto LAB_00108989;
    if (v < 10) goto LAB_001089c6;
  }
  else {
    (*this->_sink->_vptr_Sink[2])(this->_sink,0x31);
LAB_00108742:
    auVar3._8_8_ = 0;
    auVar3._0_8_ = v;
    uVar1 = SUB164(auVar3 / ZEXT816(1000000000000000000),0);
    uVar7 = uVar1 - 10 & 0xff;
    if (v < 10000000000000000000) {
      uVar7 = uVar1;
    }
    (*this->_sink->_vptr_Sink[2])
              (this->_sink,(ulong)(uint)(int)(char)((ulong)uVar7 | 0x30),v % 1000000000000000000,
               (ulong)uVar7 | 0x30);
LAB_0010876c:
    auVar4._8_8_ = 0;
    auVar4._0_8_ = v;
    (*this->_sink->_vptr_Sink[2])
              (this->_sink,(ulong)(byte)(SUB161(auVar4 / ZEXT816(100000000000000000),0) % 10 | 0x30)
               ,v % 100000000000000000);
LAB_0010879b:
    auVar5._8_8_ = 0;
    auVar5._0_8_ = v;
    uVar1 = (uint)SUB162(auVar5 / ZEXT816(10000000000000000),0) % 10;
    (*this->_sink->_vptr_Sink[2])(this->_sink,(ulong)(byte)uVar1 | 0x30,(ulong)(ushort)uVar1 | 0x30)
    ;
LAB_001087bc:
    auVar6._8_8_ = 0;
    auVar6._0_8_ = v;
    uVar1 = (uint)SUB162(auVar6 / ZEXT816(1000000000000000),0) % 10;
    (*this->_sink->_vptr_Sink[2])(this->_sink,(ulong)(byte)uVar1 | 0x30,(ulong)(ushort)uVar1 | 0x30)
    ;
LAB_001087e7:
    uVar2 = (v / 100000000000000) % 10;
    (*this->_sink->_vptr_Sink[2])(this->_sink,uVar2 | 0x30,uVar2 | 0x30);
LAB_00108803:
    uVar2 = (v / 10000000000000) % 10;
    (*this->_sink->_vptr_Sink[2])(this->_sink,uVar2 | 0x30,uVar2 | 0x30);
LAB_00108829:
    uVar2 = (v / 1000000000000) % 10;
    (*this->_sink->_vptr_Sink[2])(this->_sink,uVar2 | 0x30,uVar2 | 0x30);
LAB_0010884f:
    uVar2 = (v / 100000000000) % 10;
    (*this->_sink->_vptr_Sink[2])(this->_sink,uVar2 | 0x30,uVar2 | 0x30);
LAB_00108875:
    uVar2 = (v / 10000000000) % 10;
    (*this->_sink->_vptr_Sink[2])(this->_sink,uVar2 | 0x30,uVar2 | 0x30);
LAB_0010889b:
    uVar2 = (v / 1000000000) % 10;
    (*this->_sink->_vptr_Sink[2])(this->_sink,uVar2 | 0x30,uVar2 | 0x30);
LAB_001088bd:
    uVar2 = (v / 100000000) % 10;
    (*this->_sink->_vptr_Sink[2])(this->_sink,uVar2 | 0x30,uVar2 | 0x30);
LAB_001088df:
    uVar2 = (v / 10000000) % 10;
    (*this->_sink->_vptr_Sink[2])(this->_sink,uVar2 | 0x30,uVar2 | 0x30);
LAB_00108901:
    uVar2 = (v / 1000000) % 10;
    (*this->_sink->_vptr_Sink[2])(this->_sink,uVar2 | 0x30,uVar2 | 0x30);
LAB_00108923:
    uVar2 = (v / 100000) % 10;
    (*this->_sink->_vptr_Sink[2])(this->_sink,uVar2 | 0x30,uVar2 | 0x30);
LAB_00108945:
    uVar2 = (v / 10000) % 10;
    (*this->_sink->_vptr_Sink[2])(this->_sink,uVar2 | 0x30,uVar2 | 0x30);
LAB_00108967:
    uVar2 = (v / 1000) % 10;
    (*this->_sink->_vptr_Sink[2])(this->_sink,uVar2 | 0x30,uVar2 | 0x30);
LAB_00108989:
    uVar2 = (v / 100) % 10;
    (*this->_sink->_vptr_Sink[2])(this->_sink,uVar2 | 0x30,uVar2 | 0x30);
  }
  uVar2 = (v / 10) % 10;
  (*this->_sink->_vptr_Sink[2])(this->_sink,uVar2 | 0x30,uVar2 | 0x30);
LAB_001089c6:
  (*this->_sink->_vptr_Sink[2])(this->_sink,v % 10 | 0x30,v % 10 | 0x30);
  return;
}

Assistant:

void Dumper::appendUInt(uint64_t v) {
  if (10000000000000000000ULL <= v) {
    _sink->push_back('0' + (v / 10000000000000000000ULL) % 10);
  }
  if (1000000000000000000ULL <= v) {
    _sink->push_back('0' + (v / 1000000000000000000ULL) % 10);
  }
  if (100000000000000000ULL <= v) {
    _sink->push_back('0' + (v / 100000000000000000ULL) % 10);
  }
  if (10000000000000000ULL <= v) {
    _sink->push_back('0' + (v / 10000000000000000ULL) % 10);
  }
  if (1000000000000000ULL <= v) {
    _sink->push_back('0' + (v / 1000000000000000ULL) % 10);
  }
  if (100000000000000ULL <= v) {
    _sink->push_back('0' + (v / 100000000000000ULL) % 10);
  }
  if (10000000000000ULL <= v) {
    _sink->push_back('0' + (v / 10000000000000ULL) % 10);
  }
  if (1000000000000ULL <= v) {
    _sink->push_back('0' + (v / 1000000000000ULL) % 10);
  }
  if (100000000000ULL <= v) {
    _sink->push_back('0' + (v / 100000000000ULL) % 10);
  }
  if (10000000000ULL <= v) {
    _sink->push_back('0' + (v / 10000000000ULL) % 10);
  }
  if (1000000000ULL <= v) {
    _sink->push_back('0' + (v / 1000000000ULL) % 10);
  }
  if (100000000ULL <= v) {
    _sink->push_back('0' + (v / 100000000ULL) % 10);
  }
  if (10000000ULL <= v) {
    _sink->push_back('0' + (v / 10000000ULL) % 10);
  }
  if (1000000ULL <= v) {
    _sink->push_back('0' + (v / 1000000ULL) % 10);
  }
  if (100000ULL <= v) {
    _sink->push_back('0' + (v / 100000ULL) % 10);
  }
  if (10000ULL <= v) {
    _sink->push_back('0' + (v / 10000ULL) % 10);
  }
  if (1000ULL <= v) {
    _sink->push_back('0' + (v / 1000ULL) % 10);
  }
  if (100ULL <= v) {
    _sink->push_back('0' + (v / 100ULL) % 10);
  }
  if (10ULL <= v) {
    _sink->push_back('0' + (v / 10ULL) % 10);
  }

  _sink->push_back('0' + (v % 10));
}